

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriggerVariable.hpp
# Opt level: O2

void __thiscall gmlc::concurrency::TriggerVariable::reset(TriggerVariable *this)

{
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->activeLock);
  if (((this->activated)._M_base._M_i & 1U) != 0) {
    while (((this->triggered)._M_base._M_i & 1U) == 0) {
      std::unique_lock<std::mutex>::unlock(&local_20);
      trigger(this);
      std::unique_lock<std::mutex>::lock(&local_20);
    }
    LOCK();
    (this->activated)._M_base._M_i = false;
    UNLOCK();
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void reset()
    {
        std::unique_lock<std::mutex> lk(activeLock);
        if (activated.load()) {
            while (!triggered.load(std::memory_order_acquire)) {
                lk.unlock();
                trigger();
                lk.lock();
            }
            activated.store(false);
        }
    }